

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

uint Aig_RManSemiCanonicize
               (uint *pOut,uint *pIn,int nVars,char *pCanonPerm,Aig_VSig_t *pSigs,int fReturnIn)

{
  ushort *puVar1;
  Aig_VSig_t *pAVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint *pOut_00;
  uint uVar22;
  Aig_VSig_t *pAVar23;
  ulong uVar24;
  Aig_VSig_t TempSig;
  uint local_94;
  
  Aig_RManComputeVSigs(pIn,nVars,pSigs,pOut);
  uVar22 = 0;
  local_94 = 0;
  if (0 < nVars) {
    uVar24 = 0;
    local_94 = 0;
    pAVar23 = pSigs;
    do {
      uVar19 = pAVar23->nOnes;
      uVar21 = pAVar23[1].nOnes;
      uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
      if (0 < (int)((uint)(uVar19 >= uVar21 && uVar19 != uVar21) - (uint)(uVar19 < uVar21))) {
        pAVar2 = pAVar23 + 1;
        local_94 = local_94 | 1 << ((uint)uVar24 & 0x1f);
        iVar3 = pAVar23->nCofOnes[0xb];
        iVar16 = pAVar23->nOnes;
        iVar17 = pAVar23->nCofOnes[0];
        uVar4 = *(undefined8 *)(pAVar23->nCofOnes + 1);
        uVar5 = *(undefined8 *)(pAVar23->nCofOnes + 3);
        uVar6 = *(undefined8 *)(pAVar23->nCofOnes + 5);
        uVar7 = *(undefined8 *)(pAVar23->nCofOnes + 7);
        uVar8 = *(undefined8 *)(pAVar23->nCofOnes + 9);
        pAVar23->nCofOnes[0xb] = pAVar23[1].nCofOnes[0xb];
        iVar14 = pAVar2->nOnes;
        iVar15 = pAVar2->nCofOnes[0];
        uVar9 = *(undefined8 *)(pAVar23[1].nCofOnes + 1);
        uVar10 = *(undefined8 *)(pAVar23[1].nCofOnes + 3);
        uVar11 = *(undefined8 *)(pAVar23[1].nCofOnes + 5);
        uVar12 = *(undefined8 *)(pAVar23[1].nCofOnes + 9);
        *(undefined8 *)(pAVar23->nCofOnes + 7) = *(undefined8 *)(pAVar23[1].nCofOnes + 7);
        *(undefined8 *)(pAVar23->nCofOnes + 9) = uVar12;
        *(undefined8 *)(pAVar23->nCofOnes + 3) = uVar10;
        *(undefined8 *)(pAVar23->nCofOnes + 5) = uVar11;
        pAVar23->nOnes = iVar14;
        pAVar23->nCofOnes[0] = iVar15;
        *(undefined8 *)(pAVar23->nCofOnes + 1) = uVar9;
        pAVar23[1].nCofOnes[0xb] = iVar3;
        *(undefined8 *)(pAVar23[1].nCofOnes + 7) = uVar7;
        *(undefined8 *)(pAVar23[1].nCofOnes + 9) = uVar8;
        *(undefined8 *)(pAVar23[1].nCofOnes + 3) = uVar5;
        *(undefined8 *)(pAVar23[1].nCofOnes + 5) = uVar6;
        pAVar2->nOnes = iVar16;
        pAVar2->nCofOnes[0] = iVar17;
        *(undefined8 *)(pAVar23[1].nCofOnes + 1) = uVar4;
        Kit_TruthChangePhase(pIn,nVars,(uint)uVar24);
      }
      uVar24 = uVar24 + 1;
      pAVar23 = pAVar23 + 2;
    } while ((uint)nVars != uVar24);
  }
  do {
    bVar18 = true;
    if (1 < nVars) {
      uVar24 = 0;
      bVar18 = false;
      pOut_00 = pOut;
      pAVar23 = pSigs + 2;
      do {
        uVar19 = pAVar23[-2].nOnes;
        uVar21 = pAVar23->nOnes;
        uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
        ;
        pOut = pOut_00;
        if (0 < (int)((uint)(uVar19 >= uVar21 && uVar19 != uVar21) - (uint)(uVar19 < uVar21))) {
          pAVar2 = pAVar23 + -2;
          uVar22 = uVar22 + 1;
          puVar1 = (ushort *)(pCanonPerm + uVar24);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          iVar3 = pAVar23[-2].nCofOnes[0xb];
          iVar16 = pAVar2->nOnes;
          iVar17 = pAVar2->nCofOnes[0];
          uVar4 = *(undefined8 *)(pAVar23[-2].nCofOnes + 1);
          uVar5 = *(undefined8 *)(pAVar23[-2].nCofOnes + 3);
          uVar6 = *(undefined8 *)(pAVar23[-2].nCofOnes + 5);
          uVar7 = *(undefined8 *)(pAVar23[-2].nCofOnes + 7);
          uVar8 = *(undefined8 *)(pAVar23[-2].nCofOnes + 9);
          pAVar23[-2].nCofOnes[0xb] = pAVar23->nCofOnes[0xb];
          iVar14 = pAVar23->nOnes;
          iVar15 = pAVar23->nCofOnes[0];
          uVar9 = *(undefined8 *)(pAVar23->nCofOnes + 1);
          uVar10 = *(undefined8 *)(pAVar23->nCofOnes + 3);
          uVar11 = *(undefined8 *)(pAVar23->nCofOnes + 5);
          uVar12 = *(undefined8 *)(pAVar23->nCofOnes + 9);
          *(undefined8 *)(pAVar23[-2].nCofOnes + 7) = *(undefined8 *)(pAVar23->nCofOnes + 7);
          *(undefined8 *)(pAVar23[-2].nCofOnes + 9) = uVar12;
          *(undefined8 *)(pAVar23[-2].nCofOnes + 3) = uVar10;
          *(undefined8 *)(pAVar23[-2].nCofOnes + 5) = uVar11;
          pAVar2->nOnes = iVar14;
          pAVar2->nCofOnes[0] = iVar15;
          *(undefined8 *)(pAVar23[-2].nCofOnes + 1) = uVar9;
          pAVar23->nCofOnes[0xb] = iVar3;
          *(undefined8 *)(pAVar23->nCofOnes + 7) = uVar7;
          *(undefined8 *)(pAVar23->nCofOnes + 9) = uVar8;
          *(undefined8 *)(pAVar23->nCofOnes + 3) = uVar5;
          *(undefined8 *)(pAVar23->nCofOnes + 5) = uVar6;
          pAVar23->nOnes = iVar16;
          pAVar23->nCofOnes[0] = iVar17;
          *(undefined8 *)(pAVar23->nCofOnes + 1) = uVar4;
          iVar15 = pAVar23[-1].nOnes;
          iVar16 = pAVar23[-1].nCofOnes[0];
          uVar4 = *(undefined8 *)(pAVar23[-1].nCofOnes + 1);
          uVar5 = *(undefined8 *)(pAVar23[-1].nCofOnes + 3);
          uVar6 = *(undefined8 *)(pAVar23[-1].nCofOnes + 5);
          uVar7 = *(undefined8 *)(pAVar23[-1].nCofOnes + 7);
          uVar8 = *(undefined8 *)(pAVar23[-1].nCofOnes + 9);
          iVar3 = pAVar23[-1].nCofOnes[0xb];
          iVar14 = pAVar23[1].nCofOnes[0];
          uVar9 = *(undefined8 *)(pAVar23[1].nCofOnes + 1);
          uVar10 = *(undefined8 *)(pAVar23[1].nCofOnes + 3);
          uVar11 = *(undefined8 *)(pAVar23[1].nCofOnes + 5);
          uVar12 = *(undefined8 *)(pAVar23[1].nCofOnes + 7);
          uVar13 = *(undefined8 *)(pAVar23[1].nCofOnes + 9);
          pAVar23[-1].nOnes = pAVar23[1].nOnes;
          pAVar23[-1].nCofOnes[0] = iVar14;
          *(undefined8 *)(pAVar23[-1].nCofOnes + 1) = uVar9;
          pAVar23[-1].nCofOnes[0xb] = pAVar23[1].nCofOnes[0xb];
          *(undefined8 *)(pAVar23[-1].nCofOnes + 7) = uVar12;
          *(undefined8 *)(pAVar23[-1].nCofOnes + 9) = uVar13;
          *(undefined8 *)(pAVar23[-1].nCofOnes + 3) = uVar10;
          *(undefined8 *)(pAVar23[-1].nCofOnes + 5) = uVar11;
          pAVar23[1].nCofOnes[0xb] = iVar3;
          *(undefined8 *)(pAVar23[1].nCofOnes + 7) = uVar7;
          *(undefined8 *)(pAVar23[1].nCofOnes + 9) = uVar8;
          *(undefined8 *)(pAVar23[1].nCofOnes + 3) = uVar5;
          *(undefined8 *)(pAVar23[1].nCofOnes + 5) = uVar6;
          pAVar23[1].nOnes = iVar15;
          pAVar23[1].nCofOnes[0] = iVar16;
          *(undefined8 *)(pAVar23[1].nCofOnes + 1) = uVar4;
          Kit_TruthSwapAdjacentVars(pOut_00,pIn,nVars,(int)uVar24);
          bVar18 = true;
          pOut = pIn;
          pIn = pOut_00;
        }
        uVar24 = uVar24 + 1;
        pAVar23 = pAVar23 + 2;
        pOut_00 = pOut;
      } while (nVars - 1 != uVar24);
      bVar18 = !bVar18;
    }
  } while (!bVar18);
  if ((uVar22 & 1 ^ fReturnIn) != 1) {
    uVar22 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar22 = 1;
    }
    if (0 < (int)uVar22) {
      lVar20 = (ulong)uVar22 + 1;
      do {
        pOut[lVar20 + -2] = pIn[lVar20 + -2];
        lVar20 = lVar20 + -1;
      } while (1 < lVar20);
    }
  }
  return local_94;
}

Assistant:

unsigned Aig_RManSemiCanonicize( unsigned * pOut, unsigned * pIn, int nVars, char * pCanonPerm, Aig_VSig_t * pSigs, int fReturnIn )
{
    Aig_VSig_t TempSig;
    int i, Temp, fChange, Counter;
    unsigned * pTemp, uCanonPhase = 0;
    // collect signatures 
    Aig_RManComputeVSigs( pIn, nVars, pSigs, pOut );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
//        if ( pStore[2*i+0] <= pStore[2*i+1] )
        if ( Aig_RManCompareSigs( &pSigs[2*i+0], &pSigs[2*i+1], nVars ) <= 0 )
            continue;
        uCanonPhase |= (1 << i);
        TempSig = pSigs[2*i+0];
        pSigs[2*i+0] = pSigs[2*i+1];
        pSigs[2*i+1] = TempSig;
        Kit_TruthChangePhase( pIn, nVars, i );
    }
    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
//            if ( pStore[2*i] <= pStore[2*(i+1)] )
            if ( Aig_RManCompareSigs( &pSigs[2*i], &pSigs[2*(i+1)], nVars ) <= 0 )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            TempSig = pSigs[2*i];
            pSigs[2*i] = pSigs[2*(i+1)];
            pSigs[2*(i+1)] = TempSig;

            TempSig = pSigs[2*i+1];
            pSigs[2*i+1] = pSigs[2*(i+1)+1];
            pSigs[2*(i+1)+1] = TempSig;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

    // swap if it was moved an even number of times
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}